

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAttributeDeclaration.cpp
# Opt level: O2

VALUE_CONSTRAINT __thiscall
xercesc_4_0::XSAttributeDeclaration::getConstraintType(XSAttributeDeclaration *this)

{
  DefAttTypes DVar1;
  VALUE_CONSTRAINT VVar2;
  
  VVar2 = VALUE_CONSTRAINT_NONE;
  if (this->fScope == SCOPE_GLOBAL) {
    DVar1 = (this->fAttDef->super_XMLAttDef).fDefaultType;
    if (DVar1 == DefAttTypes_Min) {
      return VALUE_CONSTRAINT_DEFAULT;
    }
    if (DVar1 != Fixed) {
      return (uint)(DVar1 == Required_And_Fixed) * 2;
    }
    VVar2 = VALUE_CONSTRAINT_FIXED;
  }
  return VVar2;
}

Assistant:

XSConstants::VALUE_CONSTRAINT XSAttributeDeclaration::getConstraintType() const
{
    if (fScope != XSConstants::SCOPE_GLOBAL)
        return XSConstants::VALUE_CONSTRAINT_NONE;

    if (fAttDef->getDefaultType() == XMLAttDef::Default)
        return XSConstants::VALUE_CONSTRAINT_DEFAULT;

    if ((fAttDef->getDefaultType() == XMLAttDef::Fixed) ||
        (fAttDef->getDefaultType() == XMLAttDef::Required_And_Fixed))
        return XSConstants::VALUE_CONSTRAINT_FIXED;

    return XSConstants::VALUE_CONSTRAINT_NONE;
}